

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall pugi::xml_node::prepend_move(xml_node *this,xml_node *moved)

{
  ulong *puVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *pxVar4;
  xml_node_struct *pxVar5;
  bool bVar6;
  xml_node_struct **ppxVar7;
  xml_node *pxVar8;
  xml_node_struct *pxVar9;
  xml_node local_18;
  
  pxVar8 = &local_18;
  bVar6 = impl::anon_unknown_0::allow_move((xml_node)this->_root,(xml_node)moved->_root);
  if (bVar6) {
    pxVar2 = this->_root;
    if (pxVar2 == (xml_node_struct *)0x0) {
      __assert_fail("object",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x486,
                    "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_node_struct]"
                   );
    }
    puVar1 = (ulong *)(*(long *)((long)pxVar2 - (pxVar2->header >> 8)) + -0x40);
    *puVar1 = *puVar1 | 0x40;
    pxVar2 = moved->_root;
    pxVar3 = pxVar2->parent;
    pxVar4 = pxVar2->prev_sibling_c;
    pxVar5 = pxVar2->next_sibling;
    pxVar9 = pxVar5;
    if (pxVar5 == (xml_node_struct *)0x0) {
      pxVar9 = pxVar3->first_child;
    }
    pxVar9->prev_sibling_c = pxVar4;
    ppxVar7 = &pxVar3->first_child;
    if (pxVar4->next_sibling != (xml_node_struct *)0x0) {
      ppxVar7 = &pxVar4->next_sibling;
    }
    *ppxVar7 = pxVar5;
    pxVar2->parent = (xml_node_struct *)0x0;
    pxVar2->prev_sibling_c = (xml_node_struct *)0x0;
    pxVar2->next_sibling = (xml_node_struct *)0x0;
    pxVar2 = moved->_root;
    pxVar3 = this->_root;
    pxVar2->parent = pxVar3;
    pxVar4 = pxVar3->first_child;
    pxVar5 = pxVar2;
    if (pxVar4 != (xml_node_struct *)0x0) {
      pxVar2->prev_sibling_c = pxVar4->prev_sibling_c;
      pxVar5 = pxVar4;
    }
    pxVar5->prev_sibling_c = pxVar2;
    pxVar2->next_sibling = pxVar4;
    pxVar3->first_child = pxVar2;
    pxVar8 = moved;
  }
  else {
    xml_node(&local_18);
  }
  return (xml_node)pxVar8->_root;
}

Assistant:

PUGI__FN xml_node xml_node::prepend_move(const xml_node& moved)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		// disable document_buffer_order optimization since moving nodes around changes document order without changing buffer pointers
		impl::get_document(_root).header |= impl::xml_memory_page_contents_shared_mask;

		impl::remove_node(moved._root);
		impl::prepend_node(moved._root, _root);

		return moved;
	}